

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_handshake(ptls_iovec_t ticket,int use_early_data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ptls_context_t *ppVar4;
  ulong uVar5;
  ptls_t *ppVar6;
  uint8_t *__ptr;
  int iVar7;
  ptls_t *ppVar8;
  undefined8 uVar9;
  size_t sVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ptls_buffer_t cbuf;
  size_t consumed;
  ptls_buffer_t sbuf;
  size_t max_early_data_size;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  undefined1 local_c0e8 [16];
  undefined1 local_c0d8 [16];
  ulong local_c0c0;
  undefined1 local_c0b8 [16];
  undefined1 local_c0a8 [16];
  ptls_t *local_c090;
  ptls_buffer_t local_c088;
  ptls_t *local_c068;
  size_t local_c060;
  ptls_handshake_properties_t local_c058;
  uint8_t local_c038 [16384];
  undefined1 local_8038 [16384];
  undefined1 local_4038 [16392];
  
  local_c0a8._12_4_ = SUB84(local_c0a8._0_8_,4);
  local_c0d8._12_4_ = SUB84(local_c0d8._0_8_,4);
  local_c058.client.session_ticket.len = ticket.len;
  local_c058.client.session_ticket.base = ticket.base;
  local_c058.client.max_early_data_size = (size_t *)0x0;
  local_c058._24_1_ = 0;
  local_c060 = 0;
  ppVar8 = ptls_new(ctx,"example.com");
  ppVar4 = ctx_peer;
  local_c090 = (ptls_t *)malloc(0x130);
  if (local_c090 != (ptls_t *)0x0) {
    memset(&local_c090->state,0,0x128);
    local_c090->ctx = ppVar4;
    local_c090->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  }
  local_c0e8._8_8_ = 0x4000;
  local_c0e8._0_8_ = local_4038;
  local_c0d8._0_12_ = ZEXT812(0);
  local_c0b8._8_8_ = 0x4000;
  local_c0b8._0_8_ = local_8038;
  local_c0a8._0_12_ = ZEXT812(0);
  local_c088.base = local_c038;
  local_c088.off = 0;
  local_c088.capacity = 0x4000;
  local_c088.is_allocated = 0;
  local_c068 = ppVar8;
  if (use_early_data == 0) {
    iVar7 = ptls_handshake(ppVar8,(ptls_buffer_t *)local_c0e8,(void *)0x0,(size_t *)0x0,&local_c058)
    ;
    _ok((uint)(iVar7 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    bVar11 = local_c0d8._0_8_ != 0;
    uVar9 = 0x90;
  }
  else {
    if (ppVar4->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x8b,"void test_handshake(ptls_iovec_t, int)");
    }
    local_c058.client.max_early_data_size = &local_c060;
    iVar7 = ptls_handshake(ppVar8,(ptls_buffer_t *)local_c0e8,(void *)0x0,(size_t *)0x0,&local_c058)
    ;
    _ok((uint)(iVar7 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    _ok((uint)(local_c0d8._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x90);
    _ok((uint)(local_c060 == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x93);
    iVar7 = ptls_send(ppVar8,(ptls_buffer_t *)local_c0e8,"GET / HTTP/1.0\r\n\r\n",0x12);
    bVar11 = iVar7 == 0;
    uVar9 = 0x95;
  }
  _ok((uint)bVar11,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      uVar9);
  ppVar8 = local_c090;
  local_c0c0 = local_c0d8._0_8_;
  iVar7 = ptls_handshake(local_c090,(ptls_buffer_t *)local_c0b8,(void *)local_c0e8._0_8_,&local_c0c0
                         ,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar7 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9a);
  _ok((uint)(local_c0a8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9b);
  uVar5 = local_c0c0;
  if (use_early_data == 0) {
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xaf);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_c0d8._8_8_;
    local_c0d8 = auVar1 << 0x40;
  }
  else {
    _ok((uint)(local_c0c0 < (ulong)local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x9e);
    memmove((void *)local_c0e8._0_8_,(uint8_t *)(local_c0e8._0_8_ + uVar5),local_c0d8._0_8_ - uVar5)
    ;
    local_c0c0 = local_c0d8._0_8_ - uVar5;
    local_c0d8._0_8_ = local_c0c0;
    iVar7 = ptls_receive(ppVar8,&local_c088,(void *)local_c0e8._0_8_,&local_c0c0);
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa4);
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa5);
    sVar10 = local_c088.off;
    _ok((uint)(local_c088.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa6);
    iVar7 = bcmp(local_c088.base,"GET / HTTP/1.0\r\n\r\n",sVar10);
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa7);
    _ok((uint)((ppVar8->field_7).server.early_data != (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c0d8._8_8_;
    local_c0d8 = auVar3 << 0x40;
    local_c088.off = 0;
    iVar7 = ptls_send(ppVar8,(ptls_buffer_t *)local_c0b8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f
                     );
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xad);
  }
  ppVar8 = local_c068;
  local_c0c0 = local_c0a8._0_8_;
  iVar7 = ptls_handshake(local_c068,(ptls_buffer_t *)local_c0e8,(void *)local_c0b8._0_8_,&local_c0c0
                         ,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar7 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb5);
  _ok((uint)(local_c0d8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb6);
  uVar5 = local_c0c0;
  if (use_early_data == 0) {
    _ok((uint)(local_c0c0 == local_c0a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xbd);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_c0a8._8_8_;
    local_c0a8 = auVar2 << 0x40;
    iVar7 = ptls_send(ppVar8,(ptls_buffer_t *)local_c0e8,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc1);
    ppVar6 = local_c090;
    local_c0c0 = local_c0d8._0_8_;
    iVar7 = ptls_receive(local_c090,&local_c088,(void *)local_c0e8._0_8_,&local_c0c0);
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc5);
    _ok((uint)(local_c0c0 == local_c0d8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc6);
    _ok((uint)(local_c088.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        199);
    auVar12[0] = -(*local_c088.base == 'G');
    auVar12[1] = -(local_c088.base[1] == 'E');
    auVar12[2] = -(local_c088.base[2] == 'T');
    auVar12[3] = -(local_c088.base[3] == ' ');
    auVar12[4] = -(local_c088.base[4] == '/');
    auVar12[5] = -(local_c088.base[5] == ' ');
    auVar12[6] = -(local_c088.base[6] == 'H');
    auVar12[7] = -(local_c088.base[7] == 'T');
    auVar12[8] = -(local_c088.base[8] == 'T');
    auVar12[9] = -(local_c088.base[9] == 'P');
    auVar12[10] = -(local_c088.base[10] == '/');
    auVar12[0xb] = -(local_c088.base[0xb] == '1');
    auVar12[0xc] = -(local_c088.base[0xc] == '.');
    auVar12[0xd] = -(local_c088.base[0xd] == '0');
    auVar12[0xe] = -(local_c088.base[0xe] == '\r');
    auVar12[0xf] = -(local_c088.base[0xf] == '\n');
    auVar14[0] = -((char)*(undefined2 *)(local_c088.base + 0x10) == '\r');
    auVar14[1] = -((char)((ushort)*(undefined2 *)(local_c088.base + 0x10) >> 8) == '\n');
    auVar14[2] = 0xff;
    auVar14[3] = 0xff;
    auVar14[4] = 0xff;
    auVar14[5] = 0xff;
    auVar14[6] = 0xff;
    auVar14[7] = 0xff;
    auVar14[8] = 0xff;
    auVar14[9] = 0xff;
    auVar14[10] = 0xff;
    auVar14[0xb] = 0xff;
    auVar14[0xc] = 0xff;
    auVar14[0xd] = 0xff;
    auVar14[0xe] = 0xff;
    auVar14[0xf] = 0xff;
    auVar14 = auVar14 & auVar12;
    _ok((uint)((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        200);
    _ok((uint)((ppVar6->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc9);
    local_c088.off = 0;
    iVar7 = ptls_send(ppVar6,(ptls_buffer_t *)local_c0b8,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f
                     );
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xcd);
    local_c0c0 = local_c0a8._0_8_;
  }
  else {
    _ok((uint)(local_c0c0 < (ulong)local_c0a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xb9);
    memmove((void *)local_c0b8._0_8_,(uint8_t *)(local_c0b8._0_8_ + uVar5),local_c0a8._0_8_ - uVar5)
    ;
    local_c0c0 = local_c0a8._0_8_ - uVar5;
    local_c0a8._0_8_ = local_c0c0;
  }
  iVar7 = ptls_receive(ppVar8,&local_c088,(void *)local_c0b8._0_8_,&local_c0c0);
  sVar10 = 0;
  _ok((uint)(iVar7 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd2);
  _ok((uint)(local_c0c0 == local_c0a8._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd3);
  _ok((uint)(local_c088.off == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd4);
  auVar13[0] = -(local_c088.base[0xf] == '\r');
  auVar13[1] = -(local_c088.base[0x10] == '\n');
  auVar13[2] = -(local_c088.base[0x11] == '\r');
  auVar13[3] = -(local_c088.base[0x12] == '\n');
  auVar13[4] = -(local_c088.base[0x13] == 'h');
  auVar13[5] = -(local_c088.base[0x14] == 'e');
  auVar13[6] = -(local_c088.base[0x15] == 'l');
  auVar13[7] = -(local_c088.base[0x16] == 'l');
  auVar13[8] = -(local_c088.base[0x17] == 'o');
  auVar13[9] = -(local_c088.base[0x18] == ' ');
  auVar13[10] = -(local_c088.base[0x19] == 'w');
  auVar13[0xb] = -(local_c088.base[0x1a] == 'o');
  auVar13[0xc] = -(local_c088.base[0x1b] == 'r');
  auVar13[0xd] = -(local_c088.base[0x1c] == 'l');
  auVar13[0xe] = -(local_c088.base[0x1d] == 'd');
  auVar13[0xf] = -(local_c088.base[0x1e] == '\n');
  auVar15[0] = -(*local_c088.base == 'H');
  auVar15[1] = -(local_c088.base[1] == 'T');
  auVar15[2] = -(local_c088.base[2] == 'T');
  auVar15[3] = -(local_c088.base[3] == 'P');
  auVar15[4] = -(local_c088.base[4] == '/');
  auVar15[5] = -(local_c088.base[5] == '1');
  auVar15[6] = -(local_c088.base[6] == '.');
  auVar15[7] = -(local_c088.base[7] == '0');
  auVar15[8] = -(local_c088.base[8] == ' ');
  auVar15[9] = -(local_c088.base[9] == '2');
  auVar15[10] = -(local_c088.base[10] == '0');
  auVar15[0xb] = -(local_c088.base[0xb] == '0');
  auVar15[0xc] = -(local_c088.base[0xc] == ' ');
  auVar15[0xd] = -(local_c088.base[0xd] == 'O');
  auVar15[0xe] = -(local_c088.base[0xe] == 'K');
  auVar15[0xf] = -(local_c088.base[0xf] == '\r');
  auVar15 = auVar15 & auVar13;
  _ok((uint)((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd5);
  _ok((uint)((ppVar8->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd6);
  ppVar6 = local_c090;
  local_c088.off = 0;
  if (use_early_data != 0) {
    local_c0c0 = local_c0d8._0_8_;
    iVar7 = ptls_receive(local_c090,&local_c088,(void *)local_c0e8._0_8_,&local_c0c0);
    _ok((uint)(iVar7 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdc);
    _ok((uint)(local_c0d8._0_8_ == local_c0c0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdd);
    sVar10 = local_c088.off;
    _ok((uint)(local_c088.off == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xde);
    _ok((uint)((ppVar8->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdf);
  }
  (*ptls_clear_memory)((void *)local_c0e8._0_8_,local_c0d8._0_8_);
  if (local_c0d8._8_4_ != 0) {
    free((void *)local_c0e8._0_8_);
  }
  local_c0d8 = (undefined1  [16])0x0;
  local_c0e8 = (undefined1  [16])0x0;
  (*ptls_clear_memory)((void *)local_c0b8._0_8_,local_c0a8._0_8_);
  if (local_c0a8._8_4_ != 0) {
    free((void *)local_c0b8._0_8_);
  }
  __ptr = local_c088.base;
  local_c0a8 = (undefined1  [16])0x0;
  local_c0b8 = (undefined1  [16])0x0;
  (*ptls_clear_memory)(local_c088.base,sVar10);
  if (local_c088.is_allocated != 0) {
    free(__ptr);
  }
  ptls_free(ppVar8);
  ptls_free(ppVar6);
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int use_early_data)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{ticket}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    client = ptls_new(ctx, "example.com");
    server = ptls_new(ctx_peer, NULL);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (use_early_data) {
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
    }
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);

    if (use_early_data) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(ptls_is_early_data(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;

        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(!ptls_is_early_data(server));
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(!ptls_is_early_data(client));
    decbuf.off = 0;

    if (use_early_data) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(!ptls_is_early_data(client));
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}